

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

wstring_view __thiscall mjs::ltrim(mjs *this,wstring_view s,version ver)

{
  bool bVar1;
  mjs *__pos;
  size_t start_pos;
  mjs *pmVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  wstring_view wVar4;
  wstring_view s_local;
  
  pmVar2 = (mjs *)0x0;
  s_local._M_len = (size_t)this;
  s_local._M_str = (wchar_t *)s._M_len;
  while ((__pos = this, this != pmVar2 &&
         (bVar1 = is_whitespace_or_line_terminator
                            ((char16_t)((wchar_t *)s._M_len)[(long)pmVar2],(version)s._M_str),
         __pos = pmVar2, bVar1))) {
    pmVar2 = pmVar2 + 1;
  }
  bVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                    (&s_local,(size_type)__pos,0xffffffffffffffff);
  wVar4._M_len = bVar3._M_len;
  wVar4._M_str = bVar3._M_str;
  return wVar4;
}

Assistant:

std::wstring_view ltrim(std::wstring_view s, version ver) {
    size_t start_pos = 0;
    while (start_pos < s.length() && is_whitespace_or_line_terminator(s[start_pos], ver)) {
        ++start_pos;
    }
    return s.substr(start_pos);
}